

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prob.cpp
# Opt level: O0

bool f_noncentral_check(double a,int m,int n)

{
  int n_local;
  int m_local;
  double a_local;
  
  if (a <= 0.0) {
    std::operator<<((ostream *)&std::cerr," \n");
    std::operator<<((ostream *)&std::cerr,"F_NONCENTRAL_CHECK - Warning!\n");
    std::operator<<((ostream *)&std::cerr,"  A <= 0.\n");
    exit(1);
  }
  if (m < 1) {
    std::operator<<((ostream *)&std::cerr,"\n");
    std::operator<<((ostream *)&std::cerr,"F_NONCENTRAL_CHECK - Warning!\n");
    std::operator<<((ostream *)&std::cerr,"  M <= 0.\n");
    a_local._7_1_ = false;
  }
  else if (n < 1) {
    std::operator<<((ostream *)&std::cerr,"\n");
    std::operator<<((ostream *)&std::cerr,"F_NONCENTRAL_CHECK - Warning!\n");
    std::operator<<((ostream *)&std::cerr,"  N <= 0.\n");
    a_local._7_1_ = false;
  }
  else {
    a_local._7_1_ = true;
  }
  return a_local._7_1_;
}

Assistant:

bool f_noncentral_check ( double a, int m, int n )

//****************************************************************************80
//
//  Purpose:
//
//    F_NONCENTRAL_CHECK checks the parameters of the F noncentral PDF.
//
//  Licensing:
//
//    This code is distributed under the GNU LGPL license.
//
//  Modified:
//
//    30 October 2004
//
//  Author:
//
//    John Burkardt
//
//  Parameters:
//
//    Input, double A, a parameter of the PDF.
//
//    Input, int M, N, the parameters of the PDF.
//    1 <= M,
//    1 <= N.
//
//    Output, bool F_NONCENTRAL_CHECK, is true if the parameters are legal.
//
{
  if ( a <= 0.0 )
  {
    cerr << " \n";
    cerr << "F_NONCENTRAL_CHECK - Warning!\n";
    cerr << "  A <= 0.\n";
    exit ( 1 );
  }

  if ( m <= 0 )
  {
    cerr << "\n";
    cerr << "F_NONCENTRAL_CHECK - Warning!\n";
    cerr << "  M <= 0.\n";
    return false;
  }

  if ( n <= 0 )
  {
    cerr << "\n";
    cerr << "F_NONCENTRAL_CHECK - Warning!\n";
    cerr << "  N <= 0.\n";
    return false;
  }

  return true;
}